

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O3

bool __thiscall ON_Extrusion::Trim(ON_Extrusion *this,int dir,ON_Interval *domain)

{
  ON_Interval *this_00;
  ON_Interval *this_01;
  double dVar1;
  ON_Curve *pOVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar6;
  double dVar7;
  ON_Interval dom;
  ON_Interval local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  bVar3 = ON_Interval::IsIncreasing(domain);
  if (!bVar3) {
    return false;
  }
  iVar4 = 1 - dir;
  if (this->m_bTransposed == false) {
    iVar4 = dir;
  }
  if (iVar4 == 0) {
    pOVar2 = this->m_profile;
    if (pOVar2 == (ON_Curve *)0x0) {
      return false;
    }
    iVar4 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3c])(pOVar2,domain);
    ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
    return (bool)(char)iVar4;
  }
  if (iVar4 != 1) {
    return false;
  }
  this_01 = &this->m_path_domain;
  bVar3 = ON_Interval::IsIncreasing(this_01);
  if (!bVar3) {
    return false;
  }
  bVar3 = ON_Interval::operator!=(this_01,domain);
  if (!bVar3) {
    return true;
  }
  ON_Interval::ON_Interval(&local_58);
  ON_Interval::Intersection(&local_58,domain,this_01);
  bVar3 = ON_Interval::IsIncreasing(&local_58);
  if (!bVar3) {
    return false;
  }
  pdVar5 = ON_Interval::operator[](&local_58,0);
  dVar6 = ON_Interval::NormalizedParameterAt(this_01,*pdVar5);
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_8_ = dVar6;
  local_38._12_4_ = extraout_XMM0_Dd;
  pdVar5 = ON_Interval::operator[](&local_58,1);
  dVar6 = ON_Interval::NormalizedParameterAt(this_01,*pdVar5);
  local_48._8_4_ = extraout_XMM0_Dc_00;
  local_48._0_8_ = dVar6;
  local_48._12_4_ = extraout_XMM0_Dd_00;
  this_00 = &this->m_t;
  pdVar5 = ON_Interval::operator[](this_00,0);
  dVar6 = *pdVar5;
  pdVar5 = ON_Interval::operator[](this_00,1);
  dVar7 = *pdVar5;
  pdVar5 = ON_Interval::operator[](this_00,0);
  dVar1 = *pdVar5;
  pdVar5 = ON_Interval::operator[](this_00,1);
  if ((double)local_48._0_8_ <= (double)local_38._0_8_) {
    return false;
  }
  dVar6 = dVar7 * (double)local_38._0_8_ + (1.0 - (double)local_38._0_8_) * dVar6;
  dVar7 = *pdVar5 * (double)local_48._0_8_ + (1.0 - (double)local_48._0_8_) * dVar1;
  if (dVar6 < 0.0) {
    return false;
  }
  if (dVar7 <= dVar6) {
    return false;
  }
  if (1.0 < dVar7) {
    return false;
  }
  pdVar5 = ON_Interval::operator[](this_00,0);
  dVar1 = *pdVar5;
  if (dVar1 != dVar6 && 0.0 < dVar6) {
    pdVar5 = ON_Interval::operator[](this_00,0);
    *pdVar5 = dVar6;
    this->m_bHaveN[0] = false;
  }
  pdVar5 = ON_Interval::operator[](this_00,1);
  if (dVar7 < 1.0) {
    if ((dVar7 != *pdVar5) || (NAN(dVar7) || NAN(*pdVar5))) {
      pdVar5 = ON_Interval::operator[](this_00,1);
      *pdVar5 = dVar7;
      this->m_bHaveN[1] = false;
      goto LAB_003caebc;
    }
  }
  if (dVar1 == dVar6 || 0.0 >= dVar6) {
    return true;
  }
LAB_003caebc:
  this_01->m_t[0] = local_58.m_t[0];
  (this->m_path_domain).m_t[1] = local_58.m_t[1];
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  return true;
}

Assistant:

bool ON_Extrusion::Trim(
       int dir,
       const ON_Interval& domain
       )
{
  bool rc = false;
  if (!domain.IsIncreasing())
    return false;
  if ( m_bTransposed )
    dir = 1-dir;
  if ( 1 == dir )
  {
    rc = m_path_domain.IsIncreasing();
    if ( rc && m_path_domain != domain )
    {
      ON_Interval dom;
      dom.Intersection(domain,m_path_domain);
      rc = dom.IsIncreasing();
      if (rc)
      {
        double s0 = m_path_domain.NormalizedParameterAt(dom[0]);
        double s1 = m_path_domain.NormalizedParameterAt(dom[1]);
        double t0 = (1.0-s0)*m_t[0] + s0*m_t[1];
        double t1 = (1.0-s1)*m_t[0] + s1*m_t[1];
        rc = (s0 < s1 && 0.0 <= t0 && t0 < t1 && t1 <= 1.0);
        if (rc)
        {
          bool bChanged = false;
          if (t0 != m_t[0] && t0 > 0.0 )
          {
            bChanged = true;
            m_t[0] = t0;
            m_bHaveN[0] = false;
          }
          if ( t1 != m_t[1] && t1 < 1.0 )
          {
            bChanged = true;
            m_t[1] = t1;
            m_bHaveN[1] = false;
          }
          if ( bChanged )
          {
            m_path_domain = dom;
            DestroySurfaceTree();
          }
        }
      }
    }
  }
  else if ( 0 == dir )
  {
    if ( m_profile )
    {
      rc = m_profile->Trim(domain)?true:false;
      DestroySurfaceTree();
    }
  }
  return rc;
}